

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::ReversePolyPtLinks(OutPt *pp)

{
  OutPt *pOVar1;
  OutPt *pOVar2;
  OutPt *pp1;
  
  pOVar2 = pp;
  do {
    pOVar1 = pOVar2->next;
    pOVar2->next = pOVar2->prev;
    pOVar2->prev = pOVar1;
    pOVar2 = pOVar1;
  } while (pOVar1 != pp);
  return;
}

Assistant:

void ReversePolyPtLinks(OutPt &pp)
{
  OutPt *pp1, *pp2;
  pp1 = &pp;
  do {
  pp2 = pp1->next;
  pp1->next = pp1->prev;
  pp1->prev = pp2;
  pp1 = pp2;
  } while( pp1 != &pp );
}